

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::VelocityField::getValue
          (Vector3d *__return_storage_ptr__,VelocityField *this,StuntDouble *sd)

{
  StuntDouble::getVel(__return_storage_ptr__,sd);
  return __return_storage_ptr__;
}

Assistant:

Vector3d VelocityField::getValue(StuntDouble* sd) { return sd->getVel(); }